

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font_glyph * nk_font_find_glyph(nk_font *font,nk_rune unicode)

{
  uint uVar1;
  nk_font_glyph *pnVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  nk_font_config *pnVar6;
  int iVar7;
  
  if (font == (nk_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3313,
                  "const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
  }
  if (font->glyphs != (nk_font_glyph *)0x0) {
    if ((font->info).ranges == (nk_rune *)0x0) {
      __assert_fail("font->info.ranges",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x3315,
                    "const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
    }
    pnVar2 = font->fallback;
    pnVar6 = font->config;
    iVar7 = 0;
    do {
      uVar3 = nk_range_count(pnVar6->range);
      uVar4 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar4 = 0;
      }
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        uVar3 = pnVar6->range[uVar5 * 2];
        uVar1 = pnVar6->range[uVar5 * 2 + 1];
        if ((uVar3 <= unicode) && (unicode <= uVar1)) {
          return font->glyphs + ((iVar7 + unicode) - uVar3);
        }
        iVar7 = (iVar7 - uVar3) + uVar1 + 1;
      }
      pnVar6 = pnVar6->n;
      if (pnVar6 == font->config) {
        return pnVar2;
      }
    } while( true );
  }
  __assert_fail("font->glyphs",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x3314,"const struct nk_font_glyph *nk_font_find_glyph(struct nk_font *, nk_rune)");
}

Assistant:

NK_API const struct nk_font_glyph*
nk_font_find_glyph(struct nk_font *font, nk_rune unicode)
{
    int i = 0;
    int count;
    int total_glyphs = 0;
    const struct nk_font_glyph *glyph = 0;
    const struct nk_font_config *iter = 0;

    NK_ASSERT(font);
    NK_ASSERT(font->glyphs);
    NK_ASSERT(font->info.ranges);
    if (!font || !font->glyphs) return 0;

    glyph = font->fallback;
    iter = font->config;
    do {count = nk_range_count(iter->range);
        for (i = 0; i < count; ++i) {
            nk_rune f = iter->range[(i*2)+0];
            nk_rune t = iter->range[(i*2)+1];
            int diff = (int)((t - f) + 1);
            if (unicode >= f && unicode <= t)
                return &font->glyphs[((nk_rune)total_glyphs + (unicode - f))];
            total_glyphs += diff;
        }
    } while ((iter = iter->n) != font->config);
    return glyph;
}